

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnComdatEntry
          (BinaryReaderObjdump *this,ComdatType kind,Index index)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pcVar3;
  undefined1 local_40 [8];
  string_view name_1;
  string_view name;
  Index index_local;
  ComdatType kind_local;
  BinaryReaderObjdump *this_local;
  
  if (kind == Data) {
    PrintDetails(this,"    - segment[%u]",(ulong)index);
    join_0x00000010_0x00000000_ =
         BinaryReaderObjdumpBase::GetSegmentName(&this->super_BinaryReaderObjdumpBase,index);
    bVar1 = string_view::empty((string_view *)&name_1.size_);
    if (!bVar1) {
      sVar2 = string_view::length((string_view *)&name_1.size_);
      pcVar3 = string_view::data((string_view *)&name_1.size_);
      PrintDetails(this," <%.*s>",sVar2 & 0xffffffff,pcVar3);
    }
  }
  else if (kind == Function) {
    PrintDetails(this,"    - func[%u]",(ulong)index);
    _local_40 = BinaryReaderObjdumpBase::GetFunctionName(&this->super_BinaryReaderObjdumpBase,index)
    ;
    bVar1 = string_view::empty((string_view *)local_40);
    if (!bVar1) {
      sVar2 = string_view::length((string_view *)local_40);
      pcVar3 = string_view::data((string_view *)local_40);
      PrintDetails(this," <%.*s>",sVar2 & 0xffffffff,pcVar3);
    }
  }
  PrintDetails(this,"\n");
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnComdatEntry(ComdatType kind, Index index) {
  switch (kind) {
    case ComdatType::Data: {
      PrintDetails("    - segment[%" PRIindex "]", index);
      auto name = GetSegmentName(index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      break;
    }
    case ComdatType::Function: {
      PrintDetails("    - func[%" PRIindex "]", index);
      auto name = GetFunctionName(index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      break;
    }
  }
  PrintDetails("\n");
  return Result::Ok;
}